

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::InsertObjectCheck
          (Lowerer *this,RegOpnd *funcOpnd,Instr *insertBeforeInstr,BailOutKind bailOutKind,
          BailOutInfo *bailOutInfo)

{
  BailOutInstrTemplate<IR::Instr> *this_00;
  
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotObject,bailOutKind,bailOutInfo,bailOutInfo->bailOutFunc);
  IR::Instr::SetSrc1(&this_00->super_Instr,&funcOpnd->super_Opnd);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,insertBeforeInstr);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::InsertObjectCheck(IR::RegOpnd *funcOpnd, IR::Instr *insertBeforeInstr, IR::BailOutKind bailOutKind, BailOutInfo *bailOutInfo)
{
    IR::Instr *bailOutIfNotObject = IR::BailOutInstr::New(Js::OpCode::BailOnNotObject, bailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);

    // Bailout when funcOpnd is not an object.
    bailOutIfNotObject->SetSrc1(funcOpnd);
    bailOutIfNotObject->SetByteCodeOffset(insertBeforeInstr);
    insertBeforeInstr->InsertBefore(bailOutIfNotObject);

    return bailOutIfNotObject;
}